

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O3

uchar __thiscall duckdb::BinaryDeserializer::VarIntDecode<unsigned_char>(BinaryDeserializer *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint8_t byte;
  long lVar5;
  bool bVar6;
  uint8_t buffer [16];
  byte local_28 [16];
  
  pbVar4 = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  lVar5 = 0;
  do {
    (**this->stream->_vptr_ReadStream)(this->stream,local_28 + lVar5,1);
    if (-1 < (char)local_28[lVar5]) break;
    bVar6 = lVar5 != 0xf;
    lVar5 = lVar5 + 1;
  } while (bVar6);
  bVar2 = 0;
  bVar3 = 0;
  do {
    bVar1 = *pbVar4;
    bVar2 = bVar2 | (byte)((bVar1 & 0x7f) << (bVar3 & 0x1f));
    bVar3 = bVar3 + 7;
    pbVar4 = pbVar4 + 1;
  } while ((char)bVar1 < '\0');
  return bVar2;
}

Assistant:

T VarIntDecode() {
		// FIXME: maybe we should pass a source to EncodingUtil instead
		uint8_t buffer[16] = {};
		idx_t varint_size;
		for (varint_size = 0; varint_size < 16; varint_size++) {
			ReadData(buffer + varint_size, 1);
			if (!(buffer[varint_size] & 0x80)) {
				varint_size++;
				break;
			}
		}
		T value;
		auto read_size = EncodingUtil::DecodeLEB128<T>(buffer, value);
		D_ASSERT(read_size == varint_size);
		(void)read_size;
		return value;
	}